

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

void parallel_for_2d(thread_pool *thread_pool,_func_void_parallel_task_2d_ptr_size_t *compute,
                    parallel_task_2d *init,size_t task_size,range *range)

{
  size_t count;
  size_t sVar1;
  work_item *tasks_00;
  size_t chunk_size_00;
  work_item *pwVar2;
  work_item *pwVar3;
  size_t next_i;
  size_t i;
  size_t next_j;
  size_t j;
  size_t chunk_size [2];
  work_item *local_60;
  work_item *previous_task;
  work_item *first_task;
  work_item *current_task;
  work_item *tasks;
  size_t task_count;
  size_t thread_count;
  range *range_local;
  size_t task_size_local;
  parallel_task_2d *init_local;
  _func_void_parallel_task_2d_ptr_size_t *compute_local;
  thread_pool *thread_pool_local;
  
  count = get_thread_count(thread_pool);
  sVar1 = count * 2;
  tasks_00 = (work_item *)xmalloc(task_size * sVar1);
  init_parallel_tasks(tasks_00,&init->work_item,(_func_void_work_item_ptr_size_t *)compute,task_size
                      ,sVar1);
  local_60 = (work_item *)0x0;
  chunk_size_00 = compute_chunk_size(range->end - range->begin,sVar1);
  sVar1 = compute_chunk_size(range[1].end - range[1].begin,sVar1);
  next_j = range[1].begin;
  previous_task = tasks_00;
  first_task = tasks_00;
  do {
    if (range[1].end <= next_j) {
      if (local_60 != (work_item *)0x0) {
        local_60->next = (work_item *)0x0;
        submit_work(thread_pool,previous_task,local_60);
      }
      wait_for_completion(thread_pool,0);
      free(tasks_00);
      return;
    }
    pwVar2 = (work_item *)range_end(next_j,sVar1,range[1].end);
    for (next_i = range->begin; next_i < range->end; next_i = chunk_size_00 + next_i) {
      pwVar3 = (work_item *)range_end(next_i,chunk_size_00,range->end);
      if (first_task == (work_item *)0x0) {
        __assert_fail("current_task",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                      ,0x132,
                      "void parallel_for_2d(struct thread_pool *, void (*)(struct parallel_task_2d *, size_t), struct parallel_task_2d *, size_t, const struct range *)"
                     );
      }
      first_task[1].work_fn = (work_fn_t)next_i;
      first_task[1].next = pwVar3;
      first_task[2].work_fn = (work_fn_t)next_j;
      first_task[2].next = pwVar2;
      local_60 = first_task;
      pwVar3 = first_task->next;
      if (first_task->next == (work_item *)0x0) {
        submit_work(thread_pool,previous_task,first_task);
        previous_task = wait_for_completion(thread_pool,count);
        local_60 = (work_item *)0x0;
        pwVar3 = previous_task;
      }
      first_task = pwVar3;
    }
    next_j = sVar1 + next_j;
  } while( true );
}

Assistant:

void parallel_for_2d(
    struct thread_pool* thread_pool,
    void (*compute)(struct parallel_task_2d*, size_t),
    struct parallel_task_2d* init, size_t task_size,
    const struct range* range)
{
    size_t thread_count = get_thread_count(thread_pool);
    size_t task_count = thread_count * 2;
    struct work_item* tasks = xmalloc(task_size * task_count);
    init_parallel_tasks(tasks, &init->work_item, (work_fn_t)compute, task_size, task_count);

    struct work_item* current_task  = tasks;
    struct work_item* first_task    = tasks;
    struct work_item* previous_task = NULL;

    const size_t chunk_size[] = {
        compute_chunk_size(range[0].end - range[0].begin, task_count),
        compute_chunk_size(range[1].end - range[1].begin, task_count)
    };
    for (size_t j = range[1].begin; j < range[1].end; j += chunk_size[1]) {
        size_t next_j = range_end(j, chunk_size[1], range[1].end);
        for (size_t i = range[0].begin; i < range[0].end; i += chunk_size[0]) {
            size_t next_i = range_end(i, chunk_size[0], range[0].end);
            assert(current_task);
            ((struct parallel_task_2d*)current_task)->range[0].begin = i;
            ((struct parallel_task_2d*)current_task)->range[0].end   = next_i;
            ((struct parallel_task_2d*)current_task)->range[1].begin = j;
            ((struct parallel_task_2d*)current_task)->range[1].end   = next_j;
            previous_task = current_task;
            current_task = current_task->next;
            if (!current_task) {
                submit_work(thread_pool, first_task, previous_task);
                first_task = current_task = wait_for_completion(thread_pool, thread_count);
                previous_task = NULL;
            }
        }
    }
    if (previous_task) {
        previous_task->next = NULL;
        submit_work(thread_pool, first_task, previous_task);
    }
    wait_for_completion(thread_pool, 0);
    free(tasks);
}